

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  container_t *c;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  int *piVar7;
  uint8_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  uint16_t *in_R9;
  uint16_t *puVar14;
  int iVar15;
  uint32_t range_end_00;
  ulong uVar16;
  long lVar17;
  uint unaff_R15D;
  uint uVar18;
  bool bVar19;
  
  uVar16 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar16 = range_end;
  }
  if (uVar16 <= range_start) {
    return true;
  }
  if (uVar16 - range_start == 1) {
    _Var5 = roaring_bitmap_contains(r,(uint)range_start);
    return _Var5;
  }
  lVar17 = uVar16 - 1;
  uVar9 = (uint)((ulong)lVar17 >> 0x10) & 0xffff;
  uVar6 = (uint)(range_start >> 0x10) & 0xffff;
  iVar10 = uVar9 - uVar6;
  iVar2 = (r->high_low_container).size;
  if (iVar2 <= iVar10) {
    return false;
  }
  if (iVar2 == 0) {
LAB_0011d911:
    uVar18 = iVar2 - 1;
  }
  else {
    in_R9 = (r->high_low_container).keys;
    uVar12 = (ushort)(range_start >> 0x10);
    if (in_R9[(long)iVar2 + -1] == uVar12) goto LAB_0011d911;
    iVar15 = iVar2 + -1;
    uVar13 = 0;
    do {
      if (iVar15 < (int)uVar13) {
        uVar18 = ~uVar13;
        break;
      }
      uVar18 = uVar13 + iVar15 >> 1;
      uVar1 = *(ushort *)((long)in_R9 + (ulong)(uVar13 + iVar15 & 0xfffffffe));
      if (uVar1 < uVar12) {
        uVar13 = uVar18 + 1;
        bVar4 = true;
        uVar18 = unaff_R15D;
      }
      else if (uVar12 < uVar1) {
        iVar15 = uVar18 - 1;
        bVar4 = true;
        uVar18 = unaff_R15D;
      }
      else {
        bVar4 = false;
      }
      unaff_R15D = uVar18;
    } while (bVar4);
  }
  if (iVar2 != 0) {
    puVar3 = (r->high_low_container).keys;
    uVar12 = (ushort)((ulong)lVar17 >> 0x10);
    if (puVar3[(long)iVar2 + -1] != uVar12) {
      iVar15 = iVar2 + -1;
      uVar11 = 0;
      do {
        if (iVar15 < (int)uVar11) {
          uVar13 = ~uVar11;
          break;
        }
        uVar13 = uVar11 + iVar15 >> 1;
        puVar14 = (uint16_t *)(ulong)uVar13;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar11 + iVar15 & 0xfffffffe));
        if (uVar1 < uVar12) {
          uVar11 = uVar13 + 1;
          bVar4 = true;
          puVar14 = in_R9;
        }
        else if (uVar12 < uVar1) {
          iVar15 = uVar13 - 1;
          bVar4 = true;
          puVar14 = in_R9;
        }
        else {
          bVar4 = false;
        }
        uVar13 = (uint)puVar14;
        in_R9 = puVar14;
      } while (bVar4);
      goto LAB_0011d930;
    }
  }
  uVar13 = iVar2 - 1;
LAB_0011d930:
  if ((int)uVar18 < 0) {
    return false;
  }
  uVar13 = (int)uVar13 >> 0x1f ^ uVar13;
  if (uVar13 - uVar18 != iVar10) {
    return false;
  }
  uVar11 = (uint)range_start & 0xffff;
  range_end_00 = ((uint)lVar17 & 0xffff) + 1;
  uVar8 = (r->high_low_container).typecodes[uVar18 & 0xffff];
  c = (r->high_low_container).containers[uVar18 & 0xffff];
  if (uVar9 == uVar6) {
    _Var5 = container_contains_range(c,uVar11,range_end_00,uVar8);
    return _Var5;
  }
  _Var5 = container_contains_range(c,uVar11,0x10000,uVar8);
  if (!_Var5) {
    return false;
  }
  if (iVar2 <= (int)uVar13) {
    __assert_fail("ie < hlc_sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x450a,
                  "_Bool roaring_bitmap_contains_range(const roaring_bitmap_t *, uint64_t, uint64_t)"
                 );
  }
  _Var5 = container_contains_range
                    ((r->high_low_container).containers[uVar13 & 0xffff],0,range_end_00,
                     (r->high_low_container).typecodes[uVar13 & 0xffff]);
  if (!_Var5) {
    return false;
  }
  do {
    uVar18 = uVar18 + 1;
    bVar4 = (int)uVar13 <= (int)uVar18;
    if ((int)uVar13 <= (int)uVar18) {
      return bVar4;
    }
    uVar8 = (r->high_low_container).typecodes[uVar18 & 0xffff];
    piVar7 = (int *)(r->high_low_container).containers[uVar18 & 0xffff];
    if (uVar8 == '\x04') {
      uVar8 = (uint8_t)piVar7[2];
      if (uVar8 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar7 = *(int **)piVar7;
    }
    if (uVar8 == '\x03') {
      if (*piVar7 != 1) {
        return bVar4;
      }
      if (**(short **)(piVar7 + 2) != 0) {
        return bVar4;
      }
      bVar19 = (*(short **)(piVar7 + 2))[1] == -1;
    }
    else {
      if ((uVar8 != '\x02') && (uVar8 != '\x01')) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
      }
      bVar19 = *piVar7 == 0x10000;
    }
    if (!bVar19) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r, uint64_t range_start, uint64_t range_end) {
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end) return true;  // empty range are always contained!
    if (range_end - range_start == 1) return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
      return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    ie = (ie < 0 ? -ie - 1 : ie);
    if ((is < 0) || ((ie - is) != span)) {
       return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c = ra_get_container_at_index(&r->high_low_container, is,
                                               &type);
    if (hb_rs == hb_re) {
      return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
      return false;
    }
    assert(ie < hlc_sz); // would indicate an algorithmic bug
    c = ra_get_container_at_index(&r->high_low_container, ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, i, &type);
        if (!container_is_full(c, type) ) {
          return false;
        }
    }
    return true;
}